

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O3

Vec_Wec_t * Gia_Iso2ManPerform(Gia_Man_t *pGia,int fVerbose)

{
  int iVar1;
  Gia_Iso2Man_t *p;
  Vec_Wec_t *pVVar2;
  long lVar3;
  long lVar4;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  lVar3 = -1;
  lVar4 = -1;
  if (-1 < iVar1) {
    lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p = Gia_Iso2ManStart(pGia);
  Gia_Iso2ManPrepare(pGia);
  Gia_Iso2ManPropagate(pGia);
  iVar1 = clock_gettime(3,&local_40);
  if (-1 < iVar1) {
    lVar3 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Gia_Iso2ManPrint(p,lVar3 - lVar4,fVerbose);
  iVar1 = Gia_Iso2ManUniqify(p);
  if (iVar1 != 0) {
    do {
      iVar1 = clock_gettime(3,&local_40);
      if (iVar1 < 0) {
        lVar3 = -1;
      }
      else {
        lVar3 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      Gia_Iso2ManPrint(p,lVar3 - lVar4,fVerbose);
      Gia_Iso2ManPropagate(pGia);
      iVar1 = Gia_Iso2ManUniqify(p);
    } while (iVar1 != 0);
  }
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Gia_Iso2ManPrint(p,lVar3 - lVar4,fVerbose);
  Gia_Iso2ManStop(p);
  pVVar2 = Gia_Iso2ManDerivePoClasses(pGia);
  return pVVar2;
}

Assistant:

Vec_Wec_t * Gia_Iso2ManPerform( Gia_Man_t * pGia, int fVerbose )
{
    Gia_Iso2Man_t * p;
    abctime clk = Abc_Clock();
    p = Gia_Iso2ManStart( pGia );
    Gia_Iso2ManPrepare( pGia );
    Gia_Iso2ManPropagate( pGia );
    Gia_Iso2ManPrint( p, Abc_Clock() - clk, fVerbose );
    while ( Gia_Iso2ManUniqify( p ) )
    {
        Gia_Iso2ManPrint( p, Abc_Clock() - clk, fVerbose );
        Gia_Iso2ManPropagate( pGia );
    }
    Gia_Iso2ManPrint( p, Abc_Clock() - clk, fVerbose );
/*
    Gia_Iso2ManUpdate( p, 20 );
    while ( Gia_Iso2ManUniqify( p ) )
    {
        Gia_Iso2ManPrint( p, Abc_Clock() - clk, fVerbose );
        Gia_Iso2ManPropagate( pGia );
    }
    Gia_Iso2ManPrint( p, Abc_Clock() - clk, fVerbose );
*/
    Gia_Iso2ManStop( p );
    return Gia_Iso2ManDerivePoClasses( pGia );
}